

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O2

CURLcode Curl_resolver_is_resolved(connectdata *conn,Curl_dns_entry **entry)

{
  int iVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  CURLcode CVar6;
  uint uVar7;
  timediff_t tVar8;
  long lVar9;
  uint uVar10;
  curltime newer;
  curltime older;
  curltime cVar11;
  
  pCVar2 = conn->data;
  pvVar3 = (conn->async).os_specific;
  *entry = (Curl_dns_entry *)0x0;
  if (pvVar3 == (void *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  iVar1 = *(int *)((long)pvVar3 + 0x20);
  pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  if (iVar1 != 0) {
    getaddrinfo_complete(conn);
    if ((conn->async).dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(&conn->async);
      *entry = (conn->async).dns;
      return CURLE_OK;
    }
    CVar6 = resolver_error(conn);
    destroy_async_data(&conn->async);
    return CVar6;
  }
  cVar11 = Curl_now();
  uVar4 = (pCVar2->progress).t_startsingle.tv_sec;
  uVar5 = (pCVar2->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar11._0_12_,0);
  newer.tv_usec = SUB124(cVar11._0_12_,8);
  older._12_4_ = 0;
  tVar8 = Curl_timediff(newer,older);
  lVar9 = 0;
  if (0 < tVar8) {
    lVar9 = tVar8;
  }
  if (*(int *)((long)pvVar3 + 8) == 0) {
    uVar7 = 1;
  }
  else {
    uVar10 = *(int *)((long)pvVar3 + 8) << (*(long *)((long)pvVar3 + 0x10) <= lVar9);
    uVar7 = 0xfa;
    if (uVar10 < 0xfa) {
      uVar7 = uVar10;
    }
    if ((lVar9 < *(long *)((long)pvVar3 + 0x10)) && (uVar10 < 0xfb)) goto LAB_00135db8;
  }
  *(uint *)((long)pvVar3 + 8) = uVar7;
LAB_00135db8:
  *(ulong *)((long)pvVar3 + 0x10) = lVar9 + (ulong)uVar7;
  Curl_expire(conn->data,(ulong)uVar7,EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolver_is_resolved(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct Curl_easy *data = conn->data;
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  int done = 0;

  *entry = NULL;

  if(!td) {
    DEBUGASSERT(td);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  Curl_mutex_acquire(td->tsd.mtx);
  done = td->tsd.done;
  Curl_mutex_release(td->tsd.mtx);

  if(done) {
    getaddrinfo_complete(conn);

    if(!conn->async.dns) {
      CURLcode result = resolver_error(conn);
      destroy_async_data(&conn->async);
      return result;
    }
    destroy_async_data(&conn->async);
    *entry = conn->async.dns;
  }
  else {
    /* poll for name lookup done with exponential backoff up to 250ms */
    timediff_t elapsed = Curl_timediff(Curl_now(),
                                       data->progress.t_startsingle);
    if(elapsed < 0)
      elapsed = 0;

    if(td->poll_interval == 0)
      /* Start at 1ms poll interval */
      td->poll_interval = 1;
    else if(elapsed >= td->interval_end)
      /* Back-off exponentially if last interval expired  */
      td->poll_interval *= 2;

    if(td->poll_interval > 250)
      td->poll_interval = 250;

    td->interval_end = elapsed + td->poll_interval;
    Curl_expire(conn->data, td->poll_interval, EXPIRE_ASYNC_NAME);
  }

  return CURLE_OK;
}